

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void draw_mac_arrow_box(am_rect arrow_rect,bool active,Computed_Colors_Record *color_rec,
                       Am_Drawonable *draw)

{
  am_rect r;
  undefined7 in_register_00000011;
  Am_Style AStack_48;
  Am_Style local_40;
  am_rect arrow_rect_local;
  
  arrow_rect_local._8_8_ = arrow_rect._8_8_;
  arrow_rect_local._0_8_ = arrow_rect._0_8_;
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_Black,&color_rec->data->foreground_style,arrow_rect_local._0_8_,
             (ulong)arrow_rect_local._0_8_ >> 0x20,arrow_rect_local._8_8_,
             (ulong)arrow_rect_local._8_8_ >> 0x20,0);
  if ((int)CONCAT71(in_register_00000011,active) != 0) {
    Inset_Rect(&arrow_rect_local,1);
    r.width = arrow_rect_local.width;
    r.height = arrow_rect_local.height;
    r.left = arrow_rect_local.left;
    r.top = arrow_rect_local.top;
    Am_Style::Am_Style(&local_40,&color_rec->data->highlight_style);
    Am_Style::Am_Style(&AStack_48,&color_rec->data->background_style);
    Am_Draw_Rect_Border(r,&local_40,&AStack_48,draw);
    Am_Style::~Am_Style(&AStack_48);
    Am_Style::~Am_Style(&local_40);
  }
  return;
}

Assistant:

void
draw_mac_arrow_box(am_rect arrow_rect, bool active,
                   const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  draw->Draw_Rectangle(Am_Black, color_rec.data->foreground_style,
                       arrow_rect.left, arrow_rect.top, arrow_rect.width,
                       arrow_rect.height);
  if (active) {
    Inset_Rect(arrow_rect, 1);
    Am_Draw_Rect_Border(arrow_rect, color_rec.data->highlight_style,
                        color_rec.data->background_style, draw);
  }
}